

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O3

void update_new_objs_from_pos
               (Am_Value *objs_value,int left,int top,Am_Value *new_data_value,bool growing,
               Am_Object *command_obj)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  undefined7 in_register_00000081;
  Am_Object obj;
  Am_Value_List objs_list;
  Am_Object owner;
  int min_top;
  int min_left;
  Am_Value_List new_data_value_list;
  int max_bottom;
  int max_right;
  Am_Object local_b0;
  Am_Value_List local_a8;
  Am_Object local_98;
  int local_90;
  int local_8c;
  Am_Value_List local_88;
  Am_Value_List local_78;
  Am_Value_List local_68;
  Am_Value local_58;
  Am_Value local_48;
  int local_38;
  int local_34;
  
  if ((int)CONCAT71(in_register_00000081,growing) == 0) {
    local_b0.data = (Am_Object_Data *)0x0;
    bVar1 = Am_Value_List::Test(objs_value);
    if (bVar1) {
      Am_Value_List::Am_Value_List(&local_a8);
      Am_Value_List::Am_Value_List(&local_88);
      Am_Value_List::operator=(&local_a8,objs_value);
      local_98.data = (Am_Object_Data *)0x0;
      Am_Value_List::Am_Value_List(&local_68,&local_a8);
      calculate_group_size(&local_68,&local_8c,&local_90,&local_34,&local_38,&local_98);
      Am_Value_List::~Am_Value_List(&local_68);
      Am_Value_List::Am_Value_List(&local_78,&local_a8);
      adjust_all_objects_position_for_undo(&local_78,left - local_8c,top - local_90,&local_88);
      Am_Value_List::~Am_Value_List(&local_78);
      pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_88);
      Am_Value::operator=(new_data_value,pAVar2);
      Am_Object::Set(command_obj,100,local_8c,0);
      Am_Object::Set(command_obj,0x65,local_90,0);
      Am_Object::~Am_Object(&local_98);
      Am_Value_List::~Am_Value_List(&local_88);
      Am_Value_List::~Am_Value_List(&local_a8);
    }
    else if (objs_value->type == 0xa001) {
      Am_Object::operator=(&local_b0,objs_value);
      Am_Object::Set(&local_b0,100,left,0);
      Am_Object::Set(&local_b0,0x65,top,0);
      Am_Object::Set(command_obj,100,left,0);
      Am_Object::Set(command_obj,0x65,top,0);
      Am_Inter_Location::Am_Inter_Location((Am_Inter_Location *)&local_a8,&local_b0);
      Am_Inter_Location::Set_Growing((Am_Inter_Location *)&local_a8,false,true);
      pAVar2 = Am_Inter_Location::operator_cast_to_Am_Wrapper_((Am_Inter_Location *)&local_a8);
      Am_Value::operator=(new_data_value,pAVar2);
      Am_Inter_Location::~Am_Inter_Location((Am_Inter_Location *)&local_a8);
    }
    Am_Object::~Am_Object(&local_b0);
  }
  else {
    Am_Value::Am_Value(&local_48,objs_value);
    Am_Value::Am_Value(&local_58,new_data_value);
    update_objs_from_value(&local_48,&local_58,true,command_obj);
    Am_Value::~Am_Value(&local_58);
    Am_Value::~Am_Value(&local_48);
  }
  return;
}

Assistant:

void
update_new_objs_from_pos(Am_Value objs_value, int left, int top,
                         Am_Value &new_data_value, bool growing,
                         Am_Object &command_obj)
{
  if (growing) // then must be a single object, so new_data_value will be OK
    update_objs_from_value(objs_value, new_data_value, growing, command_obj);
  else {
    Am_Object obj;
    if (Am_Value_List::Test(objs_value)) {
      Am_Value_List objs_list, new_data_value_list;
      objs_list = objs_value;
      // calculate group offset and move
      int min_left, min_top, max_right, max_bottom;
      Am_Object owner;
      calculate_group_size(objs_list, min_left, min_top, max_right, max_bottom,
                           owner);
      adjust_all_objects_position_for_undo(objs_list, left - min_left,
                                           top - min_top, new_data_value_list);
      new_data_value = new_data_value_list;
      command_obj.Set(Am_LEFT, min_left);
      command_obj.Set(Am_TOP, min_top);
    } else if (objs_value.type == Am_OBJECT) {
      obj = objs_value;
      obj.Set(Am_LEFT, left); // , Am_NO_ANIMATION
      obj.Set(Am_TOP, top);   // , Am_NO_ANIMATION
      command_obj.Set(Am_LEFT, left);
      command_obj.Set(Am_TOP, top);
      Am_Inter_Location loc(obj);
      loc.Set_Growing(false);
      new_data_value = loc;
    }
  }
}